

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_zTXt(ucvector *out,char *keyword,char *textstring,
                  LodePNGCompressSettings *zlibsettings)

{
  size_t insize;
  char *in_RDX;
  long in_RSI;
  size_t textsize;
  size_t i;
  ucvector compressed;
  ucvector data;
  uint error;
  LodePNGCompressSettings *in_stack_ffffffffffffff88;
  uchar *in;
  ucvector *data_00;
  size_t *in_stack_ffffffffffffffa0;
  ucvector *in_stack_ffffffffffffffa8;
  ucvector local_48;
  uint local_2c;
  long local_18;
  uint local_4;
  
  local_2c = 0;
  local_18 = in_RSI;
  insize = strlen(in_RDX);
  ucvector_init(&local_48);
  ucvector_init((ucvector *)&stack0xffffffffffffffa0);
  for (in = (uchar *)0x0; in[local_18] != '\0'; in = in + 1) {
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff88,'\0');
  }
  if ((in == (uchar *)0x0) || ((uchar *)0x4f < in)) {
    local_4 = 0x59;
  }
  else {
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff88,'\0');
    ucvector_push_back((ucvector *)in_stack_ffffffffffffff88,'\0');
    local_2c = zlib_compress(&in_stack_ffffffffffffffa8->data,in_stack_ffffffffffffffa0,in,insize,
                             in_stack_ffffffffffffff88);
    if (local_2c == 0) {
      local_2c = 0;
      for (data_00 = (ucvector *)0x0; data_00 != in_stack_ffffffffffffffa8;
          data_00 = (ucvector *)((long)&data_00->data + 1)) {
        ucvector_push_back((ucvector *)in_stack_ffffffffffffff88,'\0');
      }
      local_2c = addChunk(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                          (uchar *)data_00,insize);
    }
    ucvector_cleanup((void *)0x212faf);
    ucvector_cleanup((void *)0x212fb9);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static unsigned addChunk_zTXt(ucvector* out, const char* keyword, const char* textstring,
                              LodePNGCompressSettings* zlibsettings)
{
  unsigned error = 0;
  ucvector data, compressed;
  size_t i, textsize = strlen(textstring);

  ucvector_init(&data);
  ucvector_init(&compressed);
  for(i = 0; keyword[i] != 0; ++i) ucvector_push_back(&data, (unsigned char)keyword[i]);
  if(i < 1 || i > 79) return 89; /*error: invalid keyword size*/
  ucvector_push_back(&data, 0); /*0 termination char*/
  ucvector_push_back(&data, 0); /*compression method: 0*/

  error = zlib_compress(&compressed.data, &compressed.size,
                        (unsigned char*)textstring, textsize, zlibsettings);
  if(!error)
  {
    for(i = 0; i != compressed.size; ++i) ucvector_push_back(&data, compressed.data[i]);
    error = addChunk(out, "zTXt", data.data, data.size);
  }

  ucvector_cleanup(&compressed);
  ucvector_cleanup(&data);
  return error;
}